

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall tf::TFProfObserver::Summary::dump_tsum(Summary *this,ostream *os)

{
  vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
  *__last;
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  anon_class_16_2_f9735b72 __f;
  size_t min_w;
  size_t max_w;
  size_t count_w;
  size_t avg_w;
  size_t time_w;
  string local_50;
  
  count_w = 5;
  time_w = 9;
  avg_w = 8;
  min_w = 8;
  max_w = 8;
  __last = &this->wsum;
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_1_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_bc718827)&count_w);
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_2_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_6d10d0c3)&time_w);
  __f.time_w = &time_w;
  __f.avg_w = &avg_w;
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_3_>
            ((TaskSummary *)this,(TaskSummary *)__last,__f);
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_4_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_a84b54ea)&min_w);
  std::
  for_each<tf::TFProfObserver::TaskSummary_const*,tf::TFProfObserver::Summary::dump_tsum(std::ostream&)const::_lambda(auto:1_const&)_5_>
            ((TaskSummary *)this,(TaskSummary *)__last,(anon_class_8_1_a847d77c)&max_w);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 10;
  poVar1 = std::operator<<(os,"-Task-");
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)((int)count_w + 2);
  poVar1 = std::operator<<(poVar1,"Count");
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)((int)time_w + 2);
  poVar1 = std::operator<<(poVar1,"Time (us)");
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)((int)avg_w + 2);
  poVar1 = std::operator<<(poVar1,"Avg (us)");
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)((int)min_w + 2);
  poVar1 = std::operator<<(poVar1,"Min (us)");
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)((int)max_w + 2);
  poVar1 = std::operator<<(poVar1,"Max (us)");
  std::operator<<(poVar1,'\n');
  for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 4) {
    if ((&(this->tsum)._M_elems[0].count)[lVar3] != 0) {
      *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 10;
      pcVar2 = to_string(*(TaskType *)((long)&TASK_TYPES + lVar3));
      poVar1 = std::operator<<(os,pcVar2);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) =
           (long)((count_w << 0x20) + 0x200000000) >> 0x20;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) =
           (long)((time_w << 0x20) + 0x200000000) >> 0x20;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) =
           (long)((avg_w << 0x20) + 0x200000000) >> 0x20;
      std::__cxx11::to_string
                (&local_50,
                 (float)(&(this->tsum)._M_elems[0].total_span)[lVar3] /
                 (float)(&(this->tsum)._M_elems[0].count)[lVar3]);
      poVar1 = std::operator<<(poVar1,(string *)&local_50);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) =
           (long)((min_w << 0x20) + 0x200000000) >> 0x20;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) =
           (long)((max_w << 0x20) + 0x200000000) >> 0x20;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,'\n');
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

inline void TFProfObserver::Summary::dump_tsum(std::ostream& os) const {

  // task summary
  size_t type_w{10}, count_w{5}, time_w{9}, avg_w{8}, min_w{8}, max_w{8};

  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
	count_w = (std::max)(count_w, std::to_string(i.count).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    time_w = (std::max)(time_w, std::to_string(i.total_span).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    avg_w = (std::max)(time_w, std::to_string(i.avg_span()).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    min_w = (std::max)(min_w, std::to_string(i.min_span).size());
  });
  
  std::for_each(tsum.begin(), tsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    max_w = (std::max)(max_w, std::to_string(i.max_span).size());
  });

  os << std::setw(type_w) << "-Task-" 
     << std::setw(count_w+2) << "Count"
     << std::setw(time_w+2) << "Time (us)"
     << std::setw(avg_w+2) << "Avg (us)"
     << std::setw(min_w+2) << "Min (us)"
     << std::setw(max_w+2) << "Max (us)"
     << '\n';

  for(size_t i=0; i<TASK_TYPES.size(); i++) {
    if(tsum[i].count == 0) {
      continue;
    }
    os << std::setw(type_w) << to_string(TASK_TYPES[i])
       << std::setw(count_w+2) << tsum[i].count
       << std::setw(time_w+2) << tsum[i].total_span
       << std::setw(avg_w+2) << std::to_string(tsum[i].avg_span())
       << std::setw(min_w+2) << tsum[i].min_span
       << std::setw(max_w+2) << tsum[i].max_span
       << '\n';
  }
}